

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O2

void __thiscall CHud::RenderDeadNotification(CHud *this)

{
  CGameClient *pCVar1;
  CNetObj_PlayerInfo *pCVar2;
  IGraphics *pIVar3;
  ITextRender *pIVar4;
  int iVar5;
  char *pcVar6;
  
  pCVar1 = (this->super_CComponent).m_pClient;
  if ((((((pCVar1->m_Snap).m_pGameData)->m_GameStateFlags == 0) &&
       ((long)pCVar1->m_LocalClientID != -1)) &&
      (pCVar1->m_aClients[pCVar1->m_LocalClientID].m_Team != -1)) &&
     ((pCVar2 = (pCVar1->m_Snap).m_pLocalInfo, pCVar2 != (CNetObj_PlayerInfo *)0x0 &&
      ((pCVar2->m_PlayerFlags & 0x10) != 0)))) {
    if (RenderDeadNotification()::s_Cursor == '\0') {
      iVar5 = __cxa_guard_acquire(&RenderDeadNotification()::s_Cursor);
      if (iVar5 != 0) {
        CTextCursor::CTextCursor(&RenderDeadNotification::s_Cursor,16.0,0);
        __cxa_atexit(CTextCursor::~CTextCursor,&RenderDeadNotification::s_Cursor,&__dso_handle);
        __cxa_guard_release(&RenderDeadNotification()::s_Cursor);
      }
    }
    pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
    RenderDeadNotification::s_Cursor.m_CursorPos.field_0.x =
         ((float)pIVar3->m_ScreenWidth / (float)pIVar3->m_ScreenHeight) * 150.0;
    RenderDeadNotification::s_Cursor.m_CursorPos.field_1.y = 50.0;
    RenderDeadNotification::s_Cursor.m_Align = 1;
    pcVar6 = Localize("Wait for next round","");
    CTextCursor::Reset(&RenderDeadNotification::s_Cursor,(long)g_Localization.m_CurrentVersion);
    pIVar4 = ((this->super_CComponent).m_pClient)->m_pTextRender;
    (*(pIVar4->super_IInterface)._vptr_IInterface[0xb])
              (pIVar4,&RenderDeadNotification::s_Cursor,pcVar6,0xffffffffffffffff);
    return;
  }
  return;
}

Assistant:

void CHud::RenderDeadNotification()
{
	if(m_pClient->m_Snap.m_pGameData->m_GameStateFlags == 0
		&& m_pClient->m_LocalClientID != -1
		&& m_pClient->m_aClients[m_pClient->m_LocalClientID].m_Team != TEAM_SPECTATORS
		&& m_pClient->m_Snap.m_pLocalInfo
		&& (m_pClient->m_Snap.m_pLocalInfo->m_PlayerFlags&PLAYERFLAG_DEAD))
	{
		static CTextCursor s_Cursor(16.0f);
		s_Cursor.MoveTo(150*Graphics()->ScreenAspect(), 50);
		s_Cursor.m_Align = TEXTALIGN_TC;

		const char *pText = Localize("Wait for next round");

		s_Cursor.Reset(g_Localization.Version());
		TextRender()->TextOutlined(&s_Cursor, pText, -1);
	}
}